

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::InternReadFile
          (LWOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_01;
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  iterator __position;
  uint *puVar4;
  undefined8 uVar5;
  long lVar6;
  undefined4 *puVar7;
  pointer pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer __src;
  SortedRep *sorted;
  pointer pvVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined4 extraout_var;
  _Node *p_Var16;
  Logger *pLVar17;
  aiMesh *paVar18;
  ulong *puVar19;
  aiVector3D *paVar20;
  aiColor4D *__s;
  _List_node_base *p_Var21;
  aiNode *paVar22;
  uint *puVar23;
  mapped_type *ppaVar24;
  aiMaterial **ppaVar25;
  aiMaterial *this_02;
  aiMesh **__dest;
  runtime_error *prVar26;
  size_t sVar27;
  long *plVar28;
  aiFace *paVar29;
  undefined4 *puVar30;
  pointer paVar31;
  pointer paVar32;
  uint uVar33;
  _List_node_base *p_Var34;
  uint mui_1;
  ulong uVar35;
  char *message;
  size_type __n;
  ulong uVar36;
  uint w_1;
  uint w;
  long lVar37;
  uint mui;
  long lVar38;
  ulong uVar39;
  aiScene *paVar40;
  aiMesh *mesh;
  uint i;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcMeshes;
  SurfaceList _mSurfaces;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pSorted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer;
  TagMappingTable _mMapping;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  apcNodes;
  aiColor4D *pvVC [8];
  aiVector3D *pvUV [8];
  LayerList _mLayers;
  uint vVColorIndices [8];
  uint vUVChannelIndices [8];
  TagList _mTags;
  aiVector3D *local_368;
  aiMesh *local_360;
  undefined8 local_358;
  uint local_34c;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_348;
  uint local_32c;
  aiColor4D *local_328;
  aiScene *local_320;
  long local_318;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_310;
  ulong local_308;
  aiMesh *local_300;
  value_type_conflict1 local_2f4;
  SortedRep *local_2f0;
  uint *local_2e8;
  aiFace *local_2e0;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  undefined1 local_288 [16];
  pointer local_278;
  _List_node_base *local_270;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [2];
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [8];
  _List_node_base *local_168;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  uint local_140;
  _List_node_base local_138;
  undefined1 local_128 [16];
  uint local_118;
  _Bit_type *local_110;
  uint local_108;
  _List_node_base *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 auStack_b0 [16];
  _List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> local_a0;
  uint local_88 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  paVar32 = (pointer)(local_1f8 + 0x10);
  local_1f8._0_8_ = paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rb","");
  iVar13 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1f8._0_8_);
  plVar28 = (long *)CONCAT44(extraout_var,iVar13);
  if ((pointer)local_1f8._0_8_ != paVar32) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8[0]._M_allocated_capacity + 1));
  }
  if (plVar28 == (long *)0x0) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_238,"Failed to open LWO file ",pFile);
    plVar28 = (long *)std::__cxx11::string::append((char *)local_238);
    local_1f8._0_8_ = *plVar28;
    paVar31 = (pointer)(plVar28 + 2);
    if ((pointer)local_1f8._0_8_ == paVar31) {
      local_1e8[0]._0_8_ = *(undefined8 *)paVar31;
      local_1e8[0]._8_8_ = plVar28[3];
      local_1f8._0_8_ = paVar32;
    }
    else {
      local_1e8[0]._0_8_ = *(undefined8 *)paVar31;
    }
    local_1f8._8_8_ = plVar28[1];
    *plVar28 = (long)paVar31;
    plVar28[1] = 0;
    *(undefined1 *)(plVar28 + 2) = 0;
    std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
    *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar14 = (**(code **)(*plVar28 + 0x30))(plVar28);
  this->fileSize = uVar14;
  if (uVar14 < 0xc) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1f8._0_8_ = paVar32;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"LWO: The file is too small to contain the IFF header","");
    std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
    *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2a0,(ulong)uVar14,(allocator_type *)local_1f8);
  (**(code **)(*plVar28 + 0x10))
            (plVar28,local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
  this->pScene = pScene;
  local_320 = pScene;
  if (*(int *)local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 0x4d524f46) {
    local_358 = (aiNode *)((ulong)local_358._4_4_ << 0x20);
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1f8._0_8_ = local_1f8 + 0x10;
    sVar27 = strlen("The file is not an IFF file: FORM chunk is missing");
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"The file is not an IFF file: FORM chunk is missing",
               "The file is not an IFF file: FORM chunk is missing" + sVar27);
    std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
    *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar14 = *(uint *)((long)local_2a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 8);
  local_358 = (aiNode *)CONCAT44(local_358._4_4_,uVar14 >> 0x18);
  uVar15 = uVar14 >> 8 & 0xff00;
  this->mFileBuffer =
       (uint8_t *)
       ((long)local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc);
  this->fileSize = this->fileSize - 0xc;
  this->hasNamedLayer = false;
  local_a0._M_impl._M_node._M_size = 0;
  local_2c8 = (pointer)0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  local_48 = (undefined1  [16])0x0;
  local_278 = (pointer)0x0;
  local_288 = (undefined1  [16])0x0;
  this->mLayers = (LayerList *)&local_a0;
  this->mTags = (TagList *)local_48;
  this->mMapping = (TagMappingTable *)local_288;
  this->mSurfaces = (SurfaceList *)local_2d8;
  local_a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0;
  local_a0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a0;
  memset((Layer *)local_1f8,0,0x90);
  local_160._M_p = (pointer)&local_150;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_140 = 3;
  local_110 = (_Bit_type *)0x0;
  local_108 = 0;
  local_100 = (_List_node_base *)0x0;
  local_138._M_next = (_List_node_base *)0x0;
  local_138._M_prev = (_List_node_base *)0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = 0;
  local_168 = (_List_node_base *)&PTR__VMapEntry_007fd2b8;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8._0_2_ = 0;
  local_d8._2_2_ = 0xffff;
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  auStack_b0._8_4_ = 0.0;
  auStack_b0[0xc] = false;
  auStack_b0._0_5_ = 0;
  auStack_b0._5_3_ = 0;
  p_Var16 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::
            _M_create_node<Assimp::LWO::Layer>
                      ((list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)&local_a0,
                       (Layer *)local_1f8);
  std::__detail::_List_node_base::_M_hook(&p_Var16->super__List_node_base);
  local_a0._M_impl._M_node._M_size = local_a0._M_impl._M_node._M_size + 1;
  LWO::Layer::~Layer((Layer *)local_1f8);
  p_Var34 = (this->mLayers->
            super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)._M_impl.
            _M_node.super__List_node_base._M_prev;
  this->mCurLayer = (Layer *)(p_Var34 + 1);
  std::__cxx11::string::_M_replace
            ((ulong)&p_Var34[0x13]._M_prev,0,(char *)p_Var34[0x14]._M_next,0x6b68cc);
  this->mCurLayer->mIndex = 0xffff;
  uVar33 = (uVar14 & 0xff00) << 8 | uVar14 << 0x18 | uVar15 | (uint)local_358;
  if (uVar33 == 0x4c574f32) {
    this->mIsLXOB = false;
    pLVar17 = DefaultLogger::get();
    message = "LWO file format: LWO2 (>= LightWave 6)";
LAB_0044a596:
    Logger::info(pLVar17,message);
  }
  else {
    if (uVar33 == 0x4c584f42) {
      this->mIsLXOB = true;
      pLVar17 = DefaultLogger::get();
      message = "LWO file format: LXOB (Modo)";
      goto LAB_0044a596;
    }
    if (uVar33 != 0x4c574f42) {
      local_268._M_impl._0_1_ = SUB41(uVar14,0);
      local_268._M_impl._1_1_ = SUB41((uVar14 & 0xff00) >> 8,0);
      local_268._M_impl._2_1_ = SUB41(uVar15 >> 8,0);
      local_268._M_impl._3_1_ = SUB81(local_358,0);
      local_268._M_impl._4_1_ = 0;
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,"Unknown LWO sub format: ","");
      plVar28 = (long *)std::__cxx11::string::append((char *)local_238);
      local_1f8._0_8_ = *plVar28;
      paVar32 = (pointer)(plVar28 + 2);
      if ((pointer)local_1f8._0_8_ == paVar32) {
        local_1e8[0]._0_8_ = *(undefined8 *)paVar32;
        local_1e8[0]._8_8_ = plVar28[3];
        local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
      }
      else {
        local_1e8[0]._0_8_ = *(undefined8 *)paVar32;
      }
      local_1f8._8_8_ = plVar28[1];
      *plVar28 = (long)paVar32;
      plVar28[1] = 0;
      *(undefined1 *)(plVar28 + 2) = 0;
      std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
      *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pLVar17 = DefaultLogger::get();
    Logger::info(pLVar17,"LWO file format: LWOB (<= LightWave 5.5)");
    this->mIsLWO2 = false;
    this->mIsLXOB = false;
    LoadLWOBFile(this);
  }
  if (uVar33 != 0x4c574f42) {
    this->mIsLWO2 = true;
    LoadLWO2File(this);
    if (this->configLayerIndex != 0xffffffff) {
      p_Var34 = (_List_node_base *)this->mLayers;
      p_Var21 = p_Var34->_M_next;
      if (p_Var21 == p_Var34) {
LAB_0044b417:
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"LWO2: The requested layer was not found","");
        std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
        *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
        __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar13 = 0;
      do {
        iVar13 = iVar13 + (*(byte *)((long)&(p_Var21 + 0x15)[1]._M_next + 4) ^ 1);
        p_Var21 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                   &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var21 != p_Var34);
      if (iVar13 != 2) goto LAB_0044b417;
    }
    if (((this->configLayerName)._M_string_length != 0) && (this->hasNamedLayer == false)) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "LWO2: Unable to find the requested layer: ",&this->configLayerName);
      std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
      *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  ResolveTags(this);
  ResolveClips(this);
  local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __n = 0;
  local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_268._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_268._M_impl.super__Rb_tree_header._M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (((int)((ulong)((long)(this->mSurfaces->
                           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3e7063e7 &
      0xfffffffeU) != 0) {
    __n = (this->mLayers->super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)
          ._M_impl._M_node._M_size;
  }
  local_268._M_impl.super__Rb_tree_header._M_header._M_right =
       local_268._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_348,__n);
  local_270 = (_List_node_base *)this->mLayers;
  p_Var34 = local_270->_M_next;
  paVar40 = local_320;
  if (p_Var34 != local_270) {
    local_32c = 0xffffffff;
    do {
      if (*(char *)((long)&(p_Var34 + 0x15)[1]._M_next + 4) == '\0') {
        local_318 = (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
        local_358 = (aiNode *)(p_Var34 + 1);
        if (((_List_node_base *)*(long *)(p_Var34 + 0x10 + 1) != (p_Var34 + 0x10)[1]._M_prev) &&
           (p_Var34[1]._M_next != p_Var34[1]._M_prev)) {
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::vector(&local_2b8,
                   ((long)(this->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7 + 1
                   ,(allocator_type *)local_1f8);
          local_34c = 0;
          lVar37 = (long)(p_Var34 + 0x10)[1]._M_prev;
          uVar14 = local_32c;
          for (lVar38 = *(long *)(p_Var34 + 0x10 + 1); lVar38 != lVar37; lVar38 = lVar38 + 0x20) {
            iVar13 = *(int *)(lVar38 + 0x18);
            if (iVar13 < 0x50544348) {
              if ((iVar13 == 0x424f4e45) || (iVar13 == 0x46414345)) {
LAB_0044a781:
                uVar35 = (ulong)*(uint *)(lVar38 + 0x10);
                if ((ulong)((long)(this->mTags->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mTags->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar35) {
                  pLVar17 = DefaultLogger::get();
                  uVar35 = 0xffffffff;
                  Logger::warn(pLVar17,"LWO: Invalid face surface index");
                }
                if ((int)uVar35 == -1) {
LAB_0044a7d8:
                  uVar15 = uVar14;
                  if (uVar14 == 0xffffffff) {
                    this_01 = this->mSurfaces;
                    pSVar1 = (this_01->
                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                    pSVar2 = (this_01->
                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    LWO::Surface::Surface((Surface *)local_1f8);
                    std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                    emplace_back<Assimp::LWO::Surface>(this_01,(Surface *)local_1f8);
                    LWO::Surface::~Surface((Surface *)local_1f8);
                    pSVar3 = (this->mSurfaces->
                             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                    pSVar3[-1].mColor.b = 0.6;
                    pSVar3[-1].mColor.r = 0.6;
                    pSVar3[-1].mColor.g = 0.6;
                    std::__cxx11::string::_M_replace
                              ((ulong)(pSVar3 + -1),0,(char *)pSVar3[-1].mName._M_string_length,
                               0x6b69d2);
                    uVar14 = (int)((ulong)((long)pSVar1 - (long)pSVar2) >> 3) * -0x3e7063e7;
                    uVar15 = uVar14;
                  }
                }
                else {
                  uVar15 = *(uint *)(local_288._0_8_ + uVar35 * 4);
                  if (*(uint *)(local_288._0_8_ + uVar35 * 4) == 0xffffffff) goto LAB_0044a7d8;
                }
                this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                          (local_2b8.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar15);
                __position._M_current = *(uint **)(this_00 + 8);
                if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_34c);
                }
                else {
                  *__position._M_current = local_34c;
                  *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
                }
              }
            }
            else if ((iVar13 == 0x53554244) || (iVar13 == 0x50544348)) goto LAB_0044a781;
            local_34c = local_34c + 1;
          }
          local_32c = uVar14;
          if (uVar14 == 0xffffffff) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::_M_erase(&local_2b8,
                       local_2b8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
          }
          if ((this->mSurfaces->
              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
              _M_impl.super__Vector_impl_data._M_finish !=
              (this->mSurfaces->
              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
              _M_impl.super__Vector_impl_data._M_start) {
            local_310 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &(p_Var34 + 1)[1]._M_prev;
            uVar35 = 0;
            do {
              pvVar12 = local_2b8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_2b8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar35].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_2b8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar35].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_308 = uVar35;
                paVar18 = (aiMesh *)operator_new(0x520);
                paVar18->mPrimitiveTypes = 0;
                paVar18->mNumVertices = 0;
                paVar18->mNumFaces = 0;
                memset(&paVar18->mVertices,0,0xcc);
                paVar18->mBones = (aiBone **)0x0;
                paVar18->mMaterialIndex = 0;
                (paVar18->mName).length = 0;
                (paVar18->mName).data[0] = '\0';
                memset((paVar18->mName).data + 1,0x1b,0x3ff);
                paVar18->mNumAnimMeshes = 0;
                paVar18->mAnimMeshes = (aiAnimMesh **)0x0;
                paVar18->mMethod = 0;
                (paVar18->mAABB).mMin.x = 0.0;
                *(undefined1 (*) [16])&(paVar18->mAABB).mMin.y = (undefined1  [16])0x0;
                (paVar18->mAABB).mMax.z = 0.0;
                paVar18->mTextureCoords[0] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[1] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[2] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[3] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[4] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[5] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[6] = (aiVector3D *)0x0;
                paVar18->mTextureCoords[7] = (aiVector3D *)0x0;
                paVar18->mNumUVComponents[0] = 0;
                paVar18->mNumUVComponents[1] = 0;
                paVar18->mNumUVComponents[2] = 0;
                paVar18->mNumUVComponents[3] = 0;
                paVar18->mNumUVComponents[4] = 0;
                paVar18->mNumUVComponents[5] = 0;
                paVar18->mNumUVComponents[6] = 0;
                paVar18->mNumUVComponents[7] = 0;
                paVar18->mColors[0] = (aiColor4D *)0x0;
                paVar18->mColors[1] = (aiColor4D *)0x0;
                paVar18->mColors[2] = (aiColor4D *)0x0;
                paVar18->mColors[3] = (aiColor4D *)0x0;
                paVar18->mColors[4] = (aiColor4D *)0x0;
                paVar18->mColors[5] = (aiColor4D *)0x0;
                paVar18->mColors[6] = (aiColor4D *)0x0;
                paVar18->mColors[7] = (aiColor4D *)0x0;
                local_360 = paVar18;
                if (local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_348,
                             (iterator)
                             local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_360);
                }
                else {
                  *local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish = paVar18;
                  local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                paVar18 = local_360;
                local_2f0 = pvVar12 + uVar35;
                local_360->mNumFaces =
                     (uint)((ulong)((long)(local_2f0->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_2f0->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2);
                puVar4 = (local_2f0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                for (puVar23 = (local_2f0->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start; puVar23 != puVar4;
                    puVar23 = puVar23 + 1) {
                  local_360->mNumVertices =
                       local_360->mNumVertices +
                       *(int *)(*(long *)(p_Var34 + 0x10 + 1) + (ulong)*puVar23 * 0x20);
                }
                uVar35 = (ulong)local_360->mNumVertices;
                local_368 = (aiVector3D *)operator_new__(uVar35 * 0xc);
                paVar22 = local_358;
                local_2e8 = puVar4;
                if (uVar35 != 0) {
                  memset(local_368,0,((uVar35 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar18->mVertices = local_368;
                uVar39 = (ulong)paVar18->mNumFaces;
                puVar19 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
                sorted = local_2f0;
                uVar35 = local_308;
                *puVar19 = uVar39;
                local_2e0 = (aiFace *)(puVar19 + 1);
                if (uVar39 != 0) {
                  paVar29 = local_2e0;
                  do {
                    paVar29->mNumIndices = 0;
                    paVar29->mIndices = (uint *)0x0;
                    paVar29 = paVar29 + 1;
                  } while (paVar29 != local_2e0 + uVar39);
                }
                paVar18->mFaces = local_2e0;
                paVar18->mMaterialIndex = (uint)local_308;
                local_88[8] = 0xffffffff;
                local_88[9] = 0xffffffff;
                local_88[10] = 0xffffffff;
                local_88[0xb] = 0xffffffff;
                local_88[0xc] = 0xffffffff;
                local_88[0xd] = 0xffffffff;
                local_88[0xe] = 0xffffffff;
                local_88[0xf] = 0xffffffff;
                local_88[0] = 0xffffffff;
                local_88[1] = 0xffffffff;
                local_88[2] = 0xffffffff;
                local_88[3] = 0xffffffff;
                local_88[4] = 0xffffffff;
                local_88[5] = 0xffffffff;
                local_88[6] = 0xffffffff;
                local_88[7] = 0xffffffff;
                FindUVChannels(this,(Surface *)(local_2d8._0_8_ + local_308 * 0x148),local_2f0,
                               (Layer *)paVar22,local_88 + 8);
                FindVCChannels(this,(Surface *)(local_2d8._0_8_ + uVar35 * 0x148),sorted,
                               (Layer *)paVar22,local_88);
                lVar38 = 0;
                do {
                  if (local_88[lVar38 + 8] == 0xffffffff) break;
                  local_300 = local_360;
                  uVar39 = (ulong)local_360->mNumVertices;
                  paVar20 = (aiVector3D *)operator_new__(uVar39 * 0xc);
                  if (uVar39 != 0) {
                    memset(paVar20,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                  }
                  local_300->mTextureCoords[lVar38] = paVar20;
                  *(aiVector3D **)(local_1f8 + lVar38 * 8) = paVar20;
                  local_360->mNumUVComponents[0] = 2;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 8);
                paVar18 = local_360;
                if (*(long *)(p_Var34 + 10 + 1) == 0) {
                  paVar20 = (aiVector3D *)0x0;
                }
                else {
                  uVar39 = (ulong)local_360->mNumVertices;
                  paVar20 = (aiVector3D *)operator_new__(uVar39 * 0xc);
                  if (uVar39 != 0) {
                    memset(paVar20,0,((uVar39 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                  }
                  paVar18->mNormals = paVar20;
                }
                lVar38 = 0;
                do {
                  if (local_88[lVar38] == 0xffffffff) break;
                  local_300 = local_360;
                  local_328 = (aiColor4D *)(ulong)local_360->mNumVertices;
                  uVar39 = (long)local_328 << 4;
                  __s = (aiColor4D *)operator_new__(uVar39);
                  if (local_328 != (aiColor4D *)0x0) {
                    local_328 = __s;
                    memset(__s,0,uVar39);
                    __s = local_328;
                  }
                  local_300->mColors[lVar38] = __s;
                  (&local_238[0]._M_dataplus)[lVar38]._M_p = (pointer)__s;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 8);
                paVar22 = local_358;
                if (((p_Var34 + 1)[1]._M_prev != p_Var34[3]._M_next) &&
                   (p_Var21 = (_List_node_base *)
                              ((long)(p_Var34 + 1)[1]._M_prev +
                              ((long)p_Var34[3]._M_next - (long)p_Var34[3]._M_next)),
                   p_Var34[3]._M_next != p_Var21)) {
                  p_Var34[3]._M_next = p_Var21;
                }
                local_2f4 = 0;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          (local_310,(ulong)local_360->mNumFaces,&local_2f4);
                puVar23 = (local_2f0->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (puVar23 != local_2e8) {
                  puVar30 = *(undefined4 **)
                             &local_310->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
                  iVar13 = 0;
                  do {
                    uVar39 = (ulong)*puVar23;
                    lVar37 = *(long *)(p_Var34 + 0x10 + 1);
                    lVar38 = lVar37 + uVar39 * 0x20;
                    *puVar30 = *(undefined4 *)(lVar37 + (uVar39 * 2 + 1) * 0x10 + 4);
                    if (*(int *)(lVar37 + uVar39 * 0x20) != 0) {
                      uVar39 = 0;
                      do {
                        uVar36 = (ulong)*(uint *)(*(long *)(lVar38 + 8) + uVar39 * 4);
                        lVar37 = *(long *)&paVar22->mName;
                        local_368->z = *(float *)(lVar37 + 8 + uVar36 * 0xc);
                        uVar5 = *(undefined8 *)(lVar37 + uVar36 * 0xc);
                        local_368->x = (float)(int)uVar5;
                        local_368->y = (float)(int)((ulong)uVar5 >> 0x20);
                        local_368 = local_368 + 1;
                        lVar37 = 0;
                        do {
                          if ((ulong)local_88[lVar37 + 8] == 0xffffffff) break;
                          lVar6 = *(long *)((long)(p_Var34 + 7)[1]._M_prev + 0x30 +
                                           (ulong)local_88[lVar37 + 8] * 0x70);
                          puVar7 = *(undefined4 **)(local_1f8 + lVar37 * 8);
                          *puVar7 = *(undefined4 *)(lVar6 + uVar36 * 8);
                          puVar7[1] = *(undefined4 *)(lVar6 + 4 + uVar36 * 8);
                          *(undefined4 **)(local_1f8 + lVar37 * 8) = puVar7 + 3;
                          lVar37 = lVar37 + 1;
                        } while (lVar37 != 8);
                        if (paVar20 == (aiVector3D *)0x0) {
                          paVar20 = (aiVector3D *)0x0;
                        }
                        else {
                          lVar37 = *(long *)(p_Var34 + 0xc + 1);
                          paVar20->z = *(float *)(lVar37 + 8 + uVar36 * 0xc);
                          uVar5 = *(undefined8 *)(lVar37 + uVar36 * 0xc);
                          paVar20->x = (float)(int)uVar5;
                          paVar20->y = (float)(int)((ulong)uVar5 >> 0x20);
                          paVar20->z = -paVar20->z;
                          paVar20 = paVar20 + 1;
                        }
                        lVar37 = 0;
                        do {
                          if ((ulong)local_88[lVar37] == 0xffffffff) break;
                          pcVar8 = (&local_238[0]._M_dataplus)[lVar37]._M_p;
                          puVar7 = (undefined4 *)
                                   (*(long *)(*(long *)(p_Var34 + 6 + 1) + 0x30 +
                                             (ulong)local_88[lVar37] * 0x70) + uVar36 * 0x10);
                          uVar9 = puVar7[1];
                          uVar10 = puVar7[2];
                          uVar11 = puVar7[3];
                          *(undefined4 *)pcVar8 = *puVar7;
                          *(undefined4 *)(pcVar8 + 4) = uVar9;
                          *(undefined4 *)(pcVar8 + 8) = uVar10;
                          *(undefined4 *)(pcVar8 + 0xc) = uVar11;
                          if (((pointer)(local_2d8._0_8_ + uVar35 * 0x148))->mVCMapType ==
                              0x52474220) {
                            pcVar8[0xc] = '\0';
                            pcVar8[0xd] = '\0';
                            pcVar8[0xe] = -0x80;
                            pcVar8[0xf] = '?';
                          }
                          (&local_238[0]._M_dataplus)[lVar37]._M_p = pcVar8 + 0x10;
                          lVar37 = lVar37 + 1;
                        } while (lVar37 != 8);
                        *(int *)(*(long *)(lVar38 + 8) + uVar39 * 4) = iVar13;
                        uVar39 = uVar39 + 1;
                        iVar13 = iVar13 + 1;
                        paVar22 = local_358;
                      } while (uVar39 < *(uint *)lVar38);
                    }
                    local_2e0->mIndices = *(uint **)(lVar38 + 8);
                    local_2e0->mNumIndices = *(uint *)lVar38;
                    *(undefined8 *)(lVar38 + 8) = 0;
                    local_2e0 = local_2e0 + 1;
                    puVar23 = puVar23 + 1;
                    puVar30 = puVar30 + 1;
                  } while (puVar23 != local_2e8);
                }
                if (local_360->mNormals == (aiVector3D *)0x0) {
                  ComputeNormals(this,local_360,local_310,
                                 (Surface *)(local_2d8._0_8_ + uVar35 * 0x148));
                  uVar35 = local_308;
                }
                else {
                  pLVar17 = DefaultLogger::get();
                  uVar35 = local_308;
                  Logger::debug(pLVar17,"LWO2: No need to compute normals, they\'re already there");
                }
              }
              uVar35 = (ulong)((int)uVar35 + 1);
              uVar39 = ((long)(this->mSurfaces->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mSurfaces->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7
              ;
            } while (uVar35 <= uVar39 && uVar39 - uVar35 != 0);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_2b8);
          paVar40 = local_320;
        }
        local_318 = local_318 >> 3;
        uVar35 = ((long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) - local_318;
        iVar13 = std::__cxx11::string::compare((char *)&p_Var34[0x13]._M_prev);
        uVar14 = (uint)uVar35;
        if (iVar13 != 0 || uVar14 != 0) {
          paVar22 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar22);
          uVar39 = *(ulong *)(p_Var34 + 0x13 + 1);
          if (uVar39 < 0x400) {
            (paVar22->mName).length = (ai_uint32)uVar39;
            memcpy((paVar22->mName).data,p_Var34[0x13]._M_prev,uVar39);
            (paVar22->mName).data[uVar39] = '\0';
          }
          paVar40 = local_320;
          paVar22->mParent = local_358;
          paVar22->mNumMeshes = uVar14;
          if (uVar14 != 0) {
            puVar23 = (uint *)operator_new__((uVar35 & 0xffffffff) << 2);
            paVar22->mMeshes = puVar23;
            if (paVar22->mNumMeshes != 0) {
              uVar35 = 0;
              do {
                paVar22->mMeshes[uVar35] = (int)local_318 + (int)uVar35;
                uVar35 = uVar35 + 1;
              } while (uVar35 < paVar22->mNumMeshes);
            }
          }
          ppaVar24 = std::
                     map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                     ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                                   *)&local_268,
                                  (key_type_conflict1 *)((long)&(p_Var34 + 0x12)[1]._M_next + 2));
          *ppaVar24 = paVar22;
        }
      }
      p_Var34 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                 &p_Var34->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var34 != local_270);
  }
  if (local_268._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar14 = (int)((long)(this->mSurfaces->
                           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mSurfaces->
                           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3e7063e7;
      paVar40->mNumMaterials = uVar14;
      ppaVar25 = (aiMaterial **)operator_new__((ulong)uVar14 << 3);
      paVar40->mMaterials = ppaVar25;
      if (paVar40->mNumMaterials != 0) {
        lVar38 = 0;
        uVar35 = 0;
        do {
          this_02 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_02);
          paVar40->mMaterials[uVar35] = this_02;
          ConvertMaterial(this,(Surface *)
                               ((long)&(((this->mSurfaces->
                                         super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->mName).
                                       _M_dataplus._M_p + lVar38),this_02);
          uVar35 = uVar35 + 1;
          lVar38 = lVar38 + 0x148;
        } while (uVar35 < paVar40->mNumMaterials);
      }
      __src = local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      paVar40->mNumMeshes =
           (uint)((ulong)((long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar35 = (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x7fffffff8;
      __dest = (aiMesh **)operator_new__(uVar35);
      paVar40->mMeshes = __dest;
      memcpy(__dest,__src,uVar35);
      GenerateNodeGraph(this,(map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                              *)&local_268);
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
      ::~_Rb_tree(&local_268);
      if (local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_348.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_,(long)local_278 - local_288._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::~vector
                ((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *)local_2d8);
      std::__cxx11::_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::_M_clear
                (&local_a0);
      if ((int *)local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start != (int *)0x0) {
        operator_delete(local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      (**(code **)(*plVar28 + 8))(plVar28);
      return;
    }
  }
  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"LWO: No meshes loaded","");
  std::runtime_error::runtime_error(prVar26,(string *)local_1f8);
  *(undefined ***)prVar26 = &PTR__runtime_error_007fa260;
  __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene,
    IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open LWO file " + pFile + ".");

    if((this->fileSize = (unsigned int)file->FileSize()) < 12)
        throw DeadlyImportError("LWO: The file is too small to contain the IFF header");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< uint8_t > mBuffer(fileSize);
    file->Read( &mBuffer[0], 1, fileSize);
    this->pScene = pScene;

    // Determine the type of the file
    uint32_t fileType;
    const char* sz = IFF::ReadHeader(&mBuffer[0],fileType);
    if (sz)throw DeadlyImportError(sz);

    mFileBuffer = &mBuffer[0] + 12;
    fileSize -= 12;

    // Initialize some members with their default values
    hasNamedLayer   = false;

    // Create temporary storage on the stack but store pointers to it in the class
    // instance. Therefore everything will be destructed properly if an exception
    // is thrown and we needn't take care of that.
    LayerList       _mLayers;
    SurfaceList     _mSurfaces;
    TagList         _mTags;
    TagMappingTable _mMapping;

    mLayers         = &_mLayers;
    mTags           = &_mTags;
    mMapping        = &_mMapping;
    mSurfaces       = &_mSurfaces;

    // Allocate a default layer (layer indices are 1-based from now)
    mLayers->push_back(Layer());
    mCurLayer = &mLayers->back();
    mCurLayer->mName = "<LWODefault>";
    mCurLayer->mIndex = -1;

    // old lightwave file format (prior to v6)
    if (AI_LWO_FOURCC_LWOB == fileType) {
        ASSIMP_LOG_INFO("LWO file format: LWOB (<= LightWave 5.5)");

        mIsLWO2 = false;
        mIsLXOB = false;
        LoadLWOBFile();
    }
    // New lightwave format
    else if (AI_LWO_FOURCC_LWO2 == fileType)    {
        mIsLXOB = false;
        ASSIMP_LOG_INFO("LWO file format: LWO2 (>= LightWave 6)");
    }
    // MODO file format
    else if (AI_LWO_FOURCC_LXOB == fileType)    {
        mIsLXOB = true;
        ASSIMP_LOG_INFO("LWO file format: LXOB (Modo)");
    }
    // we don't know this format
    else
    {
        char szBuff[5];
        szBuff[0] = (char)(fileType >> 24u);
        szBuff[1] = (char)(fileType >> 16u);
        szBuff[2] = (char)(fileType >> 8u);
        szBuff[3] = (char)(fileType);
        szBuff[4] = '\0';
        throw DeadlyImportError(std::string("Unknown LWO sub format: ") + szBuff);
    }

    if (AI_LWO_FOURCC_LWOB != fileType) {
        mIsLWO2 = true;
        LoadLWO2File();

        // The newer lightwave format allows the user to configure the
        // loader that just one layer is used. If this is the case
        // we need to check now whether the requested layer has been found.
        if (UINT_MAX != configLayerIndex) {
            unsigned int layerCount = 0;
            for(std::list<LWO::Layer>::iterator itLayers=mLayers->begin(); itLayers!=mLayers->end(); ++itLayers)
                if (!itLayers->skip)
                    layerCount++;
            if (layerCount!=2)
                throw DeadlyImportError("LWO2: The requested layer was not found");
        }

        if (configLayerName.length() && !hasNamedLayer) {
            throw DeadlyImportError("LWO2: Unable to find the requested layer: "
                + configLayerName);
        }
    }

    // now, as we have loaded all data, we can resolve cross-referenced tags and clips
    ResolveTags();
    ResolveClips();

    // now process all layers and build meshes and nodes
    std::vector<aiMesh*> apcMeshes;
    std::map<uint16_t, aiNode*> apcNodes;

    apcMeshes.reserve(mLayers->size()*std::min(((unsigned int)mSurfaces->size()/2u), 1u));

    unsigned int iDefaultSurface = UINT_MAX; // index of the default surface
	for (LWO::Layer &layer : *mLayers) {
        if (layer.skip)
            continue;

        // I don't know whether there could be dummy layers, but it would be possible
        const unsigned int meshStart = (unsigned int)apcMeshes.size();
        if (!layer.mFaces.empty() && !layer.mTempPoints.empty())    {

            // now sort all faces by the surfaces assigned to them
            std::vector<SortedRep> pSorted(mSurfaces->size()+1);

            unsigned int i = 0;
            for (FaceList::iterator it = layer.mFaces.begin(), end = layer.mFaces.end();it != end;++it,++i) {
                // Check whether we support this face's type
                if ((*it).type != AI_LWO_FACE && (*it).type != AI_LWO_PTCH &&
                    (*it).type != AI_LWO_BONE && (*it).type != AI_LWO_SUBD) {
                    continue;
                }

                unsigned int idx = (*it).surfaceIndex;
                if (idx >= mTags->size())
                {
                    ASSIMP_LOG_WARN("LWO: Invalid face surface index");
                    idx = UINT_MAX;
                }
                if(UINT_MAX == idx || UINT_MAX == (idx = _mMapping[idx]))   {
                    if (UINT_MAX == iDefaultSurface)    {
                        iDefaultSurface = (unsigned int)mSurfaces->size();
                        mSurfaces->push_back(LWO::Surface());
                        LWO::Surface& surf = mSurfaces->back();
                        surf.mColor.r = surf.mColor.g = surf.mColor.b = 0.6f;
                        surf.mName = "LWODefaultSurface";
                    }
                    idx = iDefaultSurface;
                }
                pSorted[idx].push_back(i);
            }
            if (UINT_MAX == iDefaultSurface) {
                pSorted.erase(pSorted.end()-1);
            }
            for (unsigned int p = 0,i = 0;i < mSurfaces->size();++i)    {
                SortedRep& sorted = pSorted[i];
                if (sorted.empty())
                    continue;

                // generate the mesh
                aiMesh* mesh = new aiMesh();
                apcMeshes.push_back(mesh);
                mesh->mNumFaces = (unsigned int)sorted.size();

                // count the number of vertices
                SortedRep::const_iterator it = sorted.begin(), end = sorted.end();
                for (;it != end;++it)   {
                    mesh->mNumVertices += layer.mFaces[*it].mNumIndices;
                }

                aiVector3D *nrm = NULL, * pv = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                aiFace* pf = mesh->mFaces = new aiFace[mesh->mNumFaces];
                mesh->mMaterialIndex = i;

                // find out which vertex color channels and which texture coordinate
                // channels are really required by the material attached to this mesh
                unsigned int vUVChannelIndices[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                unsigned int vVColorIndices[AI_MAX_NUMBER_OF_COLOR_SETS];

#ifdef ASSIMP_BUILD_DEBUG
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    vUVChannelIndices[mui] = UINT_MAX;
                }
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui ) {
                    vVColorIndices[mui] = UINT_MAX;
                }
#endif

                FindUVChannels(_mSurfaces[i],sorted,layer,vUVChannelIndices);
                FindVCChannels(_mSurfaces[i],sorted,layer,vVColorIndices);

                // allocate storage for UV and CV channels
                aiVector3D* pvUV[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    if (UINT_MAX == vUVChannelIndices[mui]) {
                        break;
                    }

                    pvUV[mui] = mesh->mTextureCoords[mui] = new aiVector3D[mesh->mNumVertices];

                    // LightWave doesn't support more than 2 UV components (?)
                    mesh->mNumUVComponents[0] = 2;
                }

                if (layer.mNormals.name.length())
                    nrm = mesh->mNormals = new aiVector3D[mesh->mNumVertices];

                aiColor4D* pvVC[AI_MAX_NUMBER_OF_COLOR_SETS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui) {
                    if (UINT_MAX == vVColorIndices[mui]) {
                        break;
                    }
                    pvVC[mui] = mesh->mColors[mui] = new aiColor4D[mesh->mNumVertices];
                }

                // we would not need this extra array, but the code is much cleaner if we use it
                std::vector<unsigned int>& smoothingGroups = layer.mPointReferrers;
                smoothingGroups.erase (smoothingGroups.begin(),smoothingGroups.end());
                smoothingGroups.resize(mesh->mNumFaces,0);

                // now convert all faces
                unsigned int vert = 0;
                std::vector<unsigned int>::iterator outIt = smoothingGroups.begin();
                for (it = sorted.begin(); it != end;++it,++outIt)   {
                    const LWO::Face& face = layer.mFaces[*it];
                    *outIt = face.smoothGroup;

                    // copy all vertices
                    for (unsigned int q = 0; q  < face.mNumIndices;++q,++vert)  {
                        unsigned int idx = face.mIndices[q];
                        *pv++ = layer.mTempPoints[idx] /*- layer.mPivot*/;

                        // process UV coordinates
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_TEXTURECOORDS;++w)    {
                            if (UINT_MAX == vUVChannelIndices[w]) {
                                break;
                            }
                            aiVector3D*& pp = pvUV[w];
                            const aiVector2D& src = ((aiVector2D*)&layer.mUVChannels[vUVChannelIndices[w]].rawData[0])[idx];
                            pp->x = src.x;
                            pp->y = src.y;
                            pp++;
                        }

                        // process normals (MODO extension)
                        if (nrm)    {
                            *nrm = ((aiVector3D*)&layer.mNormals.rawData[0])[idx];
                            nrm->z *= -1.f;
                            ++nrm;
                        }

                        // process vertex colors
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_COLOR_SETS;++w)   {
                            if (UINT_MAX == vVColorIndices[w]) {
                                break;
                            }
                            *pvVC[w] = ((aiColor4D*)&layer.mVColorChannels[vVColorIndices[w]].rawData[0])[idx];

                            // If a RGB color map is explicitly requested delete the
                            // alpha channel - it could theoretically be != 1.
                            if(_mSurfaces[i].mVCMapType == AI_LWO_RGB)
                                pvVC[w]->a = 1.f;

                            pvVC[w]++;
                        }

#if 0
                        // process vertex weights. We can't properly reconstruct the whole skeleton for now,
                        // but we can create dummy bones for all weight channels which we have.
                        for (unsigned int w = 0; w < layer.mWeightChannels.size();++w)
                        {
                        }
#endif

                        face.mIndices[q] = vert;
                    }
                    pf->mIndices = face.mIndices;
                    pf->mNumIndices = face.mNumIndices;
                    unsigned int** p = (unsigned int**)&face.mIndices;*p = NULL; // HACK: make sure it won't be deleted
                    pf++;
                }

                if (!mesh->mNormals)    {
                    // Compute normal vectors for the mesh - we can't use our GenSmoothNormal-
                    // Step here since it wouldn't handle smoothing groups correctly for LWO.
                    // So we use a separate implementation.
                    ComputeNormals(mesh,smoothingGroups,_mSurfaces[i]);
                }
                else {
                    ASSIMP_LOG_DEBUG("LWO2: No need to compute normals, they're already there");
                }
                ++p;
            }
        }

        // Generate nodes to render the mesh. Store the source layer in the mParent member of the nodes
        unsigned int num = static_cast<unsigned int>(apcMeshes.size() - meshStart);
        if (layer.mName != "<LWODefault>" || num > 0) {
            aiNode* pcNode = new aiNode();
            pcNode->mName.Set(layer.mName);
            pcNode->mParent = (aiNode*)&layer;
            pcNode->mNumMeshes = num;

            if (pcNode->mNumMeshes) {
                pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
                for (unsigned int p = 0; p < pcNode->mNumMeshes;++p)
                    pcNode->mMeshes[p] = p + meshStart;
            }
            apcNodes[layer.mIndex] = pcNode;
        }
    }

    if (apcNodes.empty() || apcMeshes.empty())
        throw DeadlyImportError("LWO: No meshes loaded");

    // The RemoveRedundantMaterials step will clean this up later
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = (unsigned int)mSurfaces->size()];
    for (unsigned int mat = 0; mat < pScene->mNumMaterials;++mat)   {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[mat] = pcMat;
        ConvertMaterial((*mSurfaces)[mat],pcMat);
    }

    // copy the meshes to the output structure
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes = (unsigned int)apcMeshes.size() ];
    ::memcpy(pScene->mMeshes,&apcMeshes[0],pScene->mNumMeshes*sizeof(void*));

    // generate the final node graph
    GenerateNodeGraph(apcNodes);
}